

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall Table::leafNodeInsert(Table *this,Cursor *c,uint32_t key,Row *value)

{
  char *pcVar1;
  uint32_t *puVar2;
  char *__dest;
  char *__src;
  uint local_38;
  uint32_t i;
  uint32_t numCells;
  char *node;
  Row *value_local;
  uint32_t key_local;
  Cursor *c_local;
  Table *this_local;
  
  pcVar1 = Pager::getPage(this->pager,c->pageNum);
  puVar2 = leaf_node_num_cells(pcVar1);
  if (*puVar2 < 0x27) {
    if (c->cellNum < *puVar2) {
      for (local_38 = 0; c->cellNum < local_38; local_38 = local_38 - 1) {
        __dest = leaf_node_cell(pcVar1,local_38);
        __src = leaf_node_cell(pcVar1,local_38 - 1);
        memcpy(__dest,__src,0x68);
      }
    }
    puVar2 = leaf_node_num_cells(pcVar1);
    *puVar2 = *puVar2 + 1;
    puVar2 = leaf_node_key(pcVar1,c->cellNum);
    *puVar2 = key;
    pcVar1 = leaf_node_value(pcVar1,c->cellNum);
    Row::serialize(value,pcVar1);
  }
  else {
    leafNodeSplitAndInsert(this,c,key,value);
  }
  return;
}

Assistant:

void Table::leafNodeInsert(Cursor *c, uint32_t key, Row *value) {
	char *node = pager->getPage(c->pageNum);
	uint32_t numCells = *leaf_node_num_cells(node);
	//the node is full
	if (numCells >= LEAF_NODE_MAX_CELLS) {
		//split and insert
		leafNodeSplitAndInsert(c, key, value);
		return;
	}

	if (c->cellNum < numCells) {
		for (uint32_t i = 0; i > c->cellNum; --i) {
			memcpy(leaf_node_cell(node, i), leaf_node_cell(node, i - 1), LEAF_NODE_CELL_SIZE);
		}
	}

	*(leaf_node_num_cells(node)) += 1;
	*(leaf_node_key(node, c->cellNum)) = key;
	value->serialize(leaf_node_value(node, c->cellNum));
}